

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dish.cpp
# Opt level: O0

void __thiscall zmq::dish_t::dish_t(dish_t *this,ctx_t *parent_,uint32_t tid_,int sid_)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  EVP_PKEY_CTX *ctx;
  undefined8 *in_RDI;
  char *errstr;
  int rc;
  ctx_t *in_stack_00000068;
  socket_base_t *in_stack_00000070;
  fq_t *in_stack_ffffffffffffffa0;
  msg_t *this_00;
  
  socket_base_t::socket_base_t
            (in_stack_00000070,in_stack_00000068,this._4_4_,(int)this,parent_._7_1_);
  *in_RDI = &PTR__dish_t_003e79e8;
  in_RDI[0xad] = &DAT_003e7b58;
  in_RDI[0xaf] = &PTR__dish_t_003e7b78;
  in_RDI[0xb0] = &PTR__dish_t_003e7bb0;
  fq_t::fq_t(in_stack_ffffffffffffffa0);
  dist_t::dist_t((dist_t *)in_stack_ffffffffffffffa0);
  iVar1 = (int)((ulong)(in_RDI + 0xeb) >> 0x20);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x2ed92e);
  *(undefined1 *)(in_RDI + 0xf1) = 0;
  this_00 = (msg_t *)(in_RDI + 0xf2);
  *(undefined1 *)((long)in_RDI + 0x14c) = 0xf;
  ctx = (EVP_PKEY_CTX *)0x0;
  atomic_value_t::store((atomic_value_t *)this_00,iVar1);
  iVar1 = msg_t::init(this_00,ctx);
  if (iVar1 != 0) {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    fprintf(_stderr,"%s (%s:%d)\n",pcVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/dish.cpp"
            ,0x30);
    fflush(_stderr);
    zmq_abort((char *)0x2ed9df);
  }
  return;
}

Assistant:

zmq::dish_t::dish_t (class ctx_t *parent_, uint32_t tid_, int sid_) :
    socket_base_t (parent_, tid_, sid_, true),
    _has_message (false)
{
    options.type = ZMQ_DISH;

    //  When socket is being closed down we don't want to wait till pending
    //  subscription commands are sent to the wire.
    options.linger.store (0);

    const int rc = _message.init ();
    errno_assert (rc == 0);
}